

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::write<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,char32_t *value)

{
  char32_t *pcVar1;
  char32_t *end;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> it;
  
  if (value != (char32_t *)0x0) {
    end = value + -1;
    do {
      pcVar1 = end + 1;
      end = end + 1;
    } while (*pcVar1 != L'\0');
    bVar2 = copy_str_noinline<char32_t,char32_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      (value,end,out);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar2.container;
  }
  fmt::v8::detail::throw_format_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}